

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O3

void ncnn::pack_B_tile_int8_avxvnni(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  undefined1 (*pauVar5) [32];
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar22 [32];
  
  iVar4 = cpu_support_x86_avx_vnni_int8();
  auVar3 = _DAT_005b35a0;
  if (iVar4 == 0) {
    pauVar5 = (undefined1 (*) [32])BT->data;
    uVar12 = 0;
    lVar6 = (long)k;
    lVar7 = (long)j;
    if (7 < max_jj) {
      auVar2 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar19[8] = 0x7f;
      auVar19._0_8_ = 0x7f7f7f7f7f7f7f7f;
      auVar19[9] = 0x7f;
      auVar19[10] = 0x7f;
      auVar19[0xb] = 0x7f;
      auVar19[0xc] = 0x7f;
      auVar19[0xd] = 0x7f;
      auVar19[0xe] = 0x7f;
      auVar19[0xf] = 0x7f;
      auVar19[0x10] = 0x7f;
      auVar19[0x11] = 0x7f;
      auVar19[0x12] = 0x7f;
      auVar19[0x13] = 0x7f;
      auVar19[0x14] = 0x7f;
      auVar19[0x15] = 0x7f;
      auVar19[0x16] = 0x7f;
      auVar19[0x17] = 0x7f;
      auVar19[0x18] = 0x7f;
      auVar19[0x19] = 0x7f;
      auVar19[0x1a] = 0x7f;
      auVar19[0x1b] = 0x7f;
      auVar19[0x1c] = 0x7f;
      auVar19[0x1d] = 0x7f;
      auVar19[0x1e] = 0x7f;
      auVar19[0x1f] = 0x7f;
      auVar20._8_4_ = 0xc080400;
      auVar20._0_8_ = 0xc0804000c080400;
      auVar20._12_4_ = 0xc080400;
      auVar20._16_4_ = 0xc080400;
      auVar20._20_4_ = 0xc080400;
      auVar20._24_4_ = 0xc080400;
      auVar20._28_4_ = 0xc080400;
      uVar11 = 0;
      do {
        iVar4 = B->w;
        auVar22._4_4_ = iVar4;
        auVar22._0_4_ = iVar4;
        auVar22._8_4_ = iVar4;
        auVar22._12_4_ = iVar4;
        auVar22._16_4_ = iVar4;
        auVar22._20_4_ = iVar4;
        auVar22._24_4_ = iVar4;
        auVar22._28_4_ = iVar4;
        vpmulld_avx2(auVar22,auVar2);
        if (max_kk < 4) {
          uVar14 = 0;
        }
        else {
          iVar4 = 3;
          do {
            auVar22 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
            auVar22 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar22);
            auVar22 = vpaddb_avx2(auVar22,auVar19);
            in_ZMM5 = ZEXT3264(auVar22);
            *pauVar5 = auVar22;
            pauVar5 = pauVar5 + 1;
            iVar4 = iVar4 + 4;
            uVar14 = max_kk & 0xfffffffc;
          } while (iVar4 < max_kk);
        }
        uVar16 = uVar14 | 1;
        while ((int)uVar16 < max_kk) {
          auVar22 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
          auVar22 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar22);
          auVar22 = vpshufb_avx2(auVar22,auVar3);
          auVar22 = vpermq_avx2(auVar22,0xe8);
          in_ZMM5 = ZEXT3264(auVar22);
          *(undefined1 (*) [16])*pauVar5 = auVar22._0_16_;
          pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
          uVar16 = uVar14 + 3;
          uVar14 = uVar14 + 2;
        }
        iVar4 = max_kk - uVar14;
        if (iVar4 != 0 && (int)uVar14 <= max_kk) {
          do {
            auVar22 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
            auVar22 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar22);
            auVar22 = vpshufb_avx2(auVar22,auVar20);
            auVar1 = vpunpckldq_avx(auVar22._0_16_,auVar22._16_16_);
            in_ZMM5 = ZEXT1664(auVar1);
            *(long *)*pauVar5 = auVar1._0_8_;
            pauVar5 = (undefined1 (*) [32])(*pauVar5 + 8);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        uVar12 = uVar11 + 8;
        uVar9 = uVar11 + 0xf;
        uVar11 = uVar12;
      } while (uVar9 < (uint)max_jj);
    }
    lVar8 = (long)max_jj;
    if ((int)((uint)uVar12 | 3) < max_jj) {
      auVar1 = vpmovsxbd_avx(ZEXT416(0x3020100));
      auVar18[8] = 0x7f;
      auVar18._0_8_ = 0x7f7f7f7f7f7f7f7f;
      auVar18[9] = 0x7f;
      auVar18[10] = 0x7f;
      auVar18[0xb] = 0x7f;
      auVar18[0xc] = 0x7f;
      auVar18[0xd] = 0x7f;
      auVar18[0xe] = 0x7f;
      auVar18[0xf] = 0x7f;
      uVar11 = uVar12 & 0xffffffff;
      do {
        iVar4 = B->w;
        auVar21._4_4_ = iVar4;
        auVar21._0_4_ = iVar4;
        auVar21._8_4_ = iVar4;
        auVar21._12_4_ = iVar4;
        vpmulld_avx(auVar21,auVar1);
        uVar14 = 0;
        if (3 < max_kk) {
          iVar4 = 3;
          do {
            auVar21 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
            auVar21 = vpgatherdd((undefined1  [16])0x0,auVar21);
            auVar21 = vpaddb_avx(auVar21,auVar18);
            in_ZMM5 = ZEXT1664(auVar21);
            *(undefined1 (*) [16])*pauVar5 = auVar21;
            pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
            iVar4 = iVar4 + 4;
            uVar14 = max_kk & 0xfffffffc;
          } while (iVar4 < max_kk);
        }
        uVar16 = uVar14 | 1;
        while ((int)uVar16 < max_kk) {
          auVar21 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
          auVar21 = vpgatherdd((undefined1  [16])0x0,auVar21);
          auVar21 = vpshufb_avx(auVar21,ZEXT816(0xd0c090805040100));
          in_ZMM5 = ZEXT1664(auVar21);
          *(long *)*pauVar5 = auVar21._0_8_;
          pauVar5 = (undefined1 (*) [32])(*pauVar5 + 8);
          uVar16 = uVar14 + 3;
          uVar14 = uVar14 + 2;
        }
        iVar4 = max_kk - uVar14;
        if (iVar4 != 0 && (int)uVar14 <= max_kk) {
          do {
            auVar21 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
            auVar21 = vpgatherdd((undefined1  [16])0x0,auVar21);
            auVar21 = vpshufb_avx(auVar21,SUB6416(ZEXT464(0xc080400),0));
            in_ZMM5 = ZEXT1664(auVar21);
            *(int *)*pauVar5 = auVar21._0_4_;
            pauVar5 = (undefined1 (*) [32])(*pauVar5 + 4);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        uVar12 = uVar11 + 4;
        lVar10 = uVar11 + 7;
        uVar11 = uVar12;
      } while (lVar10 < lVar8);
    }
    if ((int)((uint)uVar12 | 1) < max_jj) {
      uVar11 = uVar12 & 0xffffffff;
      do {
        lVar10 = (long)B->w * B->elemsize;
        pcVar13 = (char *)((long)B->data + (uVar11 + lVar7) * lVar10 + lVar6);
        pcVar15 = (char *)((long)B->data + (uVar11 + lVar7 + 1) * lVar10 + lVar6);
        if (max_kk < 4) {
          uVar14 = 0;
        }
        else {
          iVar4 = 3;
          do {
            (*pauVar5)[0] = *pcVar13 + '\x7f';
            (*pauVar5)[1] = pcVar13[1] + '\x7f';
            (*pauVar5)[2] = pcVar13[2] + '\x7f';
            (*pauVar5)[3] = pcVar13[3] + '\x7f';
            (*pauVar5)[4] = *pcVar15 + '\x7f';
            (*pauVar5)[5] = pcVar15[1] + '\x7f';
            (*pauVar5)[6] = pcVar15[2] + '\x7f';
            (*pauVar5)[7] = pcVar15[3] + '\x7f';
            pauVar5 = (undefined1 (*) [32])(*pauVar5 + 8);
            pcVar13 = pcVar13 + 4;
            pcVar15 = pcVar15 + 4;
            iVar4 = iVar4 + 4;
            uVar14 = max_kk & 0xfffffffc;
          } while (iVar4 < max_kk);
        }
        uVar16 = uVar14 | 1;
        while ((int)uVar16 < max_kk) {
          (*pauVar5)[0] = *pcVar13;
          (*pauVar5)[1] = pcVar13[1];
          (*pauVar5)[2] = *pcVar15;
          (*pauVar5)[3] = pcVar15[1];
          pauVar5 = (undefined1 (*) [32])(*pauVar5 + 4);
          pcVar13 = pcVar13 + 2;
          pcVar15 = pcVar15 + 2;
          uVar16 = uVar14 + 3;
          uVar14 = uVar14 + 2;
        }
        if ((int)uVar14 < max_kk) {
          lVar10 = 0;
          do {
            (*pauVar5)[0] = pcVar13[lVar10];
            (*pauVar5)[1] = pcVar15[lVar10];
            pauVar5 = (undefined1 (*) [32])(*pauVar5 + 2);
            lVar10 = lVar10 + 1;
          } while (max_kk - uVar14 != (int)lVar10);
        }
        uVar12 = uVar11 + 2;
        lVar10 = uVar11 + 3;
        uVar11 = uVar12;
      } while (lVar10 < lVar8);
    }
    if ((int)uVar12 < max_jj) {
      lVar10 = (long)(int)uVar12;
      do {
        pcVar13 = (char *)((long)B->data + lVar6 + (long)B->w * (lVar10 + lVar7) * B->elemsize);
        if (max_kk < 4) {
          uVar14 = 0;
        }
        else {
          iVar4 = 3;
          do {
            (*pauVar5)[0] = *pcVar13 + '\x7f';
            (*pauVar5)[1] = pcVar13[1] + '\x7f';
            (*pauVar5)[2] = pcVar13[2] + '\x7f';
            (*pauVar5)[3] = pcVar13[3] + '\x7f';
            pauVar5 = (undefined1 (*) [32])(*pauVar5 + 4);
            pcVar13 = pcVar13 + 4;
            iVar4 = iVar4 + 4;
            uVar14 = max_kk & 0xfffffffc;
          } while (iVar4 < max_kk);
        }
        if ((int)uVar14 < max_kk) {
          lVar17 = 0;
          do {
            (*pauVar5)[lVar17] = pcVar13[lVar17];
            lVar17 = lVar17 + 1;
          } while (max_kk - uVar14 != (int)lVar17);
          pauVar5 = (undefined1 (*) [32])(*pauVar5 + lVar17);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar8);
    }
    return;
  }
  pack_B_tile_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk);
  return;
}

Assistant:

void pack_B_tile_int8_avxvnni(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}